

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraBmc.c
# Opt level: O2

void Fra_BmcPerformSimple(Aig_Man_t *pAig,int nFrames,int nBTLimit,int fRewrite,int fVerbose)

{
  int iVar1;
  int iVar2;
  int *pModel;
  void *__ptr;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  abctime aVar7;
  Fra_Bmc_t *p;
  Fra_Man_t *__ptr_00;
  Aig_Man_t *pAVar8;
  abctime aVar9;
  Aig_Man_t *pAVar10;
  Abc_Cex_t *pAVar11;
  ulong uVar12;
  int iVar13;
  
  aVar7 = Abc_Clock();
  p = Fra_BmcStart(pAig,0,nFrames);
  __ptr_00 = Fra_LcrAigPrepare(pAig);
  __ptr_00->pBmc = p;
  pAVar8 = Fra_BmcFrames(p,1);
  p->pAigFrames = pAVar8;
  if (fVerbose != 0) {
    uVar5 = pAig->nRegs;
    iVar6 = pAig->nObjs[2];
    iVar1 = pAig->nObjs[3];
    iVar13 = pAig->nObjs[6];
    iVar2 = pAig->nObjs[5];
    uVar3 = Aig_ManLevelNum(pAig);
    printf("AIG:  PI/PO/Reg = %d/%d/%d.  Node = %6d. Lev = %5d.\n",(ulong)(iVar6 - uVar5),
           (ulong)(iVar1 - uVar5),(ulong)uVar5,(ulong)(uint)(iVar13 + iVar2),(ulong)uVar3);
    pAVar8 = p->pAigFrames;
    uVar5 = pAVar8->nObjs[2];
    uVar3 = pAVar8->nObjs[3];
    iVar6 = pAVar8->nObjs[6];
    iVar1 = pAVar8->nObjs[5];
    uVar4 = Aig_ManLevelNum(pAVar8);
    iVar13 = 0x7b779c;
    printf("Time-frames (%d):  PI/PO = %d/%d.  Node = %6d. Lev = %5d.  ",(ulong)(uint)nFrames,
           (ulong)uVar5,(ulong)uVar3,(ulong)(uint)(iVar6 + iVar1),(ulong)uVar4);
    Abc_Print(iVar13,"%s =","Time");
    aVar9 = Abc_Clock();
    Abc_Print(iVar13,"%9.2f sec\n",(double)(aVar9 - aVar7) / 1000000.0);
  }
  if (fRewrite != 0) {
    aVar7 = Abc_Clock();
    pAVar8 = p->pAigFrames;
    pAVar10 = Dar_ManRwsat(pAVar8,1,0);
    p->pAigFrames = pAVar10;
    Aig_ManStop(pAVar8);
    if (fVerbose != 0) {
      pAVar8 = p->pAigFrames;
      iVar6 = pAVar8->nObjs[6];
      iVar1 = pAVar8->nObjs[5];
      uVar5 = Aig_ManLevelNum(pAVar8);
      iVar13 = 0x7b77d8;
      printf("Time-frames after rewriting:  Node = %6d. Lev = %5d.  ",(ulong)(uint)(iVar6 + iVar1),
             (ulong)uVar5);
      Abc_Print(iVar13,"%s =","Time");
      aVar9 = Abc_Clock();
      Abc_Print(iVar13,"%9.2f sec\n",(double)(aVar9 - aVar7) / 1000000.0);
    }
  }
  aVar7 = Abc_Clock();
  iVar6 = Fra_FraigMiterAssertedOutput(p->pAigFrames);
  if (iVar6 < 0) {
    pAVar8 = Fra_FraigEquivence(p->pAigFrames,nBTLimit,1);
    p->pAigFraig = pAVar8;
    iVar6 = Fra_FraigMiterAssertedOutput(pAVar8);
    pModel = (int *)p->pAigFraig->pData;
    if (pModel != (int *)0x0) {
      pAVar11 = Fra_SmlCopyCounterExample(pAig,p->pAigFrames,pModel);
      pAig->pSeqModel = pAVar11;
      __ptr = p->pAigFraig->pData;
      if (__ptr != (void *)0x0) {
        free(__ptr);
        p->pAigFraig->pData = (void *)0x0;
      }
      goto LAB_004f1af2;
    }
    if (iVar6 < 0) goto LAB_004f1af2;
  }
  iVar1 = pAig->nRegs;
  pAVar11 = Abc_CexMakeTriv(iVar1,pAig->nObjs[2] - iVar1,pAig->nObjs[3] - iVar1,iVar6);
  pAig->pSeqModel = pAVar11;
LAB_004f1af2:
  if (fVerbose != 0) {
    pAVar8 = p->pAigFraig;
    if (pAVar8 == (Aig_Man_t *)0x0) {
      uVar5 = 0xffffffff;
      uVar12 = 0xffffffff;
    }
    else {
      uVar5 = pAVar8->nObjs[6] + pAVar8->nObjs[5];
      uVar3 = Aig_ManLevelNum(pAVar8);
      uVar12 = (ulong)uVar3;
    }
    iVar6 = 0x7d9eec;
    printf("Fraiged init frames: Node = %6d. Lev = %5d.  ",(ulong)uVar5,uVar12);
    Abc_Print(iVar6,"%s =","Time");
    aVar9 = Abc_Clock();
    Abc_Print(iVar6,"%9.2f sec\n",(double)(aVar9 - aVar7) / 1000000.0);
  }
  Fra_BmcStop(p);
  free(__ptr_00);
  return;
}

Assistant:

void Fra_BmcPerformSimple( Aig_Man_t * pAig, int nFrames, int nBTLimit, int fRewrite, int fVerbose )
{
    extern Fra_Man_t * Fra_LcrAigPrepare( Aig_Man_t * pAig );
    Fra_Man_t * pTemp;
    Fra_Bmc_t * pBmc;
    Aig_Man_t * pAigTemp;
    abctime clk;
    int iOutput;
    // derive and fraig the frames
    clk = Abc_Clock();
    pBmc = Fra_BmcStart( pAig, 0, nFrames );
    pTemp = Fra_LcrAigPrepare( pAig );
    pTemp->pBmc = pBmc;
    pBmc->pAigFrames = Fra_BmcFrames( pBmc, 1 );
    if ( fVerbose )
    {
        printf( "AIG:  PI/PO/Reg = %d/%d/%d.  Node = %6d. Lev = %5d.\n", 
            Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig), Aig_ManCoNum(pAig)-Aig_ManRegNum(pAig), Aig_ManRegNum(pAig),
            Aig_ManNodeNum(pAig), Aig_ManLevelNum(pAig) );
        printf( "Time-frames (%d):  PI/PO = %d/%d.  Node = %6d. Lev = %5d.  ", 
            nFrames, Aig_ManCiNum(pBmc->pAigFrames), Aig_ManCoNum(pBmc->pAigFrames), 
            Aig_ManNodeNum(pBmc->pAigFrames), Aig_ManLevelNum(pBmc->pAigFrames) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    if ( fRewrite )
    {
        clk = Abc_Clock();
        pBmc->pAigFrames = Dar_ManRwsat( pAigTemp = pBmc->pAigFrames, 1, 0 );
        Aig_ManStop( pAigTemp );
        if ( fVerbose )
        {
            printf( "Time-frames after rewriting:  Node = %6d. Lev = %5d.  ", 
                Aig_ManNodeNum(pBmc->pAigFrames), Aig_ManLevelNum(pBmc->pAigFrames) );
            ABC_PRT( "Time", Abc_Clock() - clk );
        }
    }
    clk = Abc_Clock();
    iOutput = Fra_FraigMiterAssertedOutput( pBmc->pAigFrames );
    if ( iOutput >= 0 )
        pAig->pSeqModel = Abc_CexMakeTriv( Aig_ManRegNum(pAig), Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig), Aig_ManCoNum(pAig)-Aig_ManRegNum(pAig), iOutput );
    else
    {
        pBmc->pAigFraig = Fra_FraigEquivence( pBmc->pAigFrames, nBTLimit, 1 );
        iOutput = Fra_FraigMiterAssertedOutput( pBmc->pAigFraig );
        if ( pBmc->pAigFraig->pData )
        {
            pAig->pSeqModel = Fra_SmlCopyCounterExample( pAig, pBmc->pAigFrames, (int *)pBmc->pAigFraig->pData );
            ABC_FREE( pBmc->pAigFraig->pData );
        }
        else if ( iOutput >= 0 )
            pAig->pSeqModel = Abc_CexMakeTriv( Aig_ManRegNum(pAig), Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig), Aig_ManCoNum(pAig)-Aig_ManRegNum(pAig), iOutput );
    }
    if ( fVerbose )
    {
        printf( "Fraiged init frames: Node = %6d. Lev = %5d.  ", 
            pBmc->pAigFraig? Aig_ManNodeNum(pBmc->pAigFraig) : -1,
            pBmc->pAigFraig? Aig_ManLevelNum(pBmc->pAigFraig) : -1 );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    Fra_BmcStop( pBmc );  
    ABC_FREE( pTemp );
}